

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

View * __thiscall gimage::View::operator=(View *this,View *v)

{
  int iVar1;
  Camera *pCVar2;
  undefined4 extraout_var;
  View *in_RSI;
  View *in_RDI;
  Image<float,_gimage::PixelTraits<float>_> *unaff_retaddr;
  View *a;
  
  if (in_RDI != in_RSI) {
    a = in_RDI;
    if (in_RDI->camera != (Camera *)0x0) {
      (*in_RDI->camera->_vptr_Camera[1])();
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)unaff_retaddr,&a->image)
    ;
    Image<float,_gimage::PixelTraits<float>_>::operator=
              (unaff_retaddr,(Image<float,_gimage::PixelTraits<float>_> *)a);
    pCVar2 = getCamera(in_RSI);
    iVar1 = (*pCVar2->_vptr_Camera[2])();
    in_RDI->camera = (Camera *)CONCAT44(extraout_var,iVar1);
  }
  return in_RDI;
}

Assistant:

View &View::operator=(const View &v)
{
  if (this != &v)
  {
    delete camera;

    image=v.image;
    depth=v.depth;
    camera=v.getCamera()->clone();
  }

  return *this;
}